

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateBuilderMembers
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer)

{
  bool bVar1;
  long in_RDI;
  FieldDescriptor *in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  bool in_stack_000000a3;
  FieldAccessorType in_stack_000000a4;
  FieldDescriptor *in_stack_000000a8;
  undefined4 in_stack_000000b0;
  FieldAccessorType in_stack_000000b4;
  FieldDescriptor *in_stack_000000b8;
  Printer *in_stack_000000c0;
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  WriteFieldAccessorDocComment
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b4,in_stack_000000b0._3_1_);
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportUnknownEnumValue((FileDescriptor *)0x5b9e42);
  if (bVar1) {
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
    WriteFieldEnumValueAccessorDocComment
              ((Printer *)CONCAT44(in_stack_000000b4,in_stack_000000b0),in_stack_000000a8,
               in_stack_000000a4,in_stack_000000a3);
    io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_GETTER);
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public java.util.List<$type$> "
                 "${$get$capitalized_name$List$}$() {\n"
                 "  return instance.get$capitalized_name$List();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_COUNT);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public int ${$get$capitalized_name$Count$}$() {\n"
      "  return instance.get$capitalized_name$Count();\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_GETTER);
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public $type$ ${$get$capitalized_name$$}$(int index) {\n"
      "  return instance.get$capitalized_name$(index);\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_INDEXED_SETTER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    int index, $type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.set$capitalized_name$(index, value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_ADDER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder "
                 "${$add$capitalized_name$$}$($type$ value) {\n"
                 "  copyOnWrite();\n"
                 "  instance.add$capitalized_name$(value);\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, LIST_MULTI_ADDER,
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$addAll$capitalized_name$$}$(\n"
                 "    java.lang.Iterable<? extends $type$> values) {\n"
                 "  copyOnWrite();\n"
                 "  instance.addAll$capitalized_name$(values);"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  copyOnWrite();\n"
      "  instance.clear$capitalized_name$();\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_);

  if (SupportUnknownEnumValue(descriptor_->file())) {
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_GETTER);
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public java.util.List<java.lang.Integer>\n"
                   "${$get$capitalized_name$ValueList$}$() {\n"
                   "  return java.util.Collections.unmodifiableList(\n"
                   "      instance.get$capitalized_name$ValueList());\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_GETTER);
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$public int "
                   "${$get$capitalized_name$Value$}$(int index) {\n"
                   "  return instance.get$capitalized_name$Value(index);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_INDEXED_SETTER,
                                          /* builder */ true);
    printer->Print(
        variables_,
        "$deprecation$public Builder ${$set$capitalized_name$Value$}$(\n"
        "    int index, int value) {\n"
        "  copyOnWrite();\n"
        "  instance.set$capitalized_name$Value(index, value);\n"
        "  return this;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_, LIST_ADDER,
                                          /* builder */ true);
    printer->Print(variables_,
                   "$deprecation$public Builder "
                   "${$add$capitalized_name$Value$}$(int value) {\n"
                   "  instance.add$capitalized_name$Value(value);\n"
                   "  return this;\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldEnumValueAccessorDocComment(printer, descriptor_,
                                          LIST_MULTI_ADDER,
                                          /* builder */ true);
    printer->Print(
        variables_,
        "$deprecation$public Builder ${$addAll$capitalized_name$Value$}$(\n"
        "    java.lang.Iterable<java.lang.Integer> values) {\n"
        "  copyOnWrite();\n"
        "  instance.addAll$capitalized_name$Value(values);\n"
        "  return this;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
  }
}